

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::Identity(ParsedScene *this,FileLoc loc)

{
  Float (*paFVar1) [4];
  bool bVar2;
  Transform *pTVar3;
  int i;
  bool bVar4;
  Transform local_a8;
  
  if (this->currentApiState == Uninitialized) {
    paFVar1 = local_a8.m.m + 1;
    local_a8.m.m[0][2] = 0.0;
    local_a8.m.m[0][3] = 0.0;
    local_a8.m.m[1]._0_8_ = local_a8.m.m[1]._0_8_ & 0xffffffffffffff00;
    local_a8.m.m[0]._0_8_ = paFVar1;
    detail::stringPrintfRecursive<char_const(&)[9]>
              ((string *)&local_a8,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [9])"Identity");
    Error(&loc,(char *)local_a8.m.m[0]._0_8_);
    if ((Float (*) [4])local_a8.m.m[0]._0_8_ != paFVar1) {
      operator_delete((void *)local_a8.m.m[0]._0_8_,local_a8.m.m[1]._0_8_ + 1);
    }
  }
  else {
    i = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      if ((this->activeTransformBits >> i & 1) != 0) {
        local_a8.mInv.m[0][0] = 0.0;
        local_a8.mInv.m[0][1] = 0.0;
        local_a8.mInv.m[0][2] = 0.0;
        local_a8.mInv.m[0][3] = 0.0;
        local_a8.mInv.m[1][0] = 0.0;
        local_a8.mInv.m[1][1] = 0.0;
        local_a8.mInv.m[1][2] = 0.0;
        local_a8.mInv.m[1][3] = 0.0;
        local_a8.mInv.m[2][0] = 0.0;
        local_a8.mInv.m[2][1] = 0.0;
        local_a8.mInv.m[2][2] = 0.0;
        local_a8.mInv.m[2][3] = 0.0;
        local_a8.mInv.m[3][0] = 0.0;
        local_a8.mInv.m[3][1] = 0.0;
        local_a8.mInv.m[3][2] = 0.0;
        local_a8.mInv.m[3][3] = 0.0;
        local_a8.m.m[0][0] = 0.0;
        local_a8.m.m[0][1] = 0.0;
        local_a8.m.m[0][2] = 0.0;
        local_a8.m.m[0][3] = 0.0;
        local_a8.m.m[1][0] = 0.0;
        local_a8.m.m[1][1] = 0.0;
        local_a8.m.m[1][2] = 0.0;
        local_a8.m.m[1][3] = 0.0;
        local_a8.m.m[2][0] = 0.0;
        local_a8.m.m[2][1] = 0.0;
        local_a8.m.m[2][2] = 0.0;
        local_a8.m.m[2][3] = 0.0;
        local_a8.m.m[3][0] = 0.0;
        local_a8.m.m[3][1] = 0.0;
        local_a8.m.m[3][2] = 0.0;
        local_a8.m.m[3][3] = 0.0;
        pbrt::Transform::Transform(&local_a8);
        pTVar3 = TransformSet::operator[](&this->curTransform,i);
        *(undefined8 *)(pTVar3->m).m[0] = local_a8.m.m[0]._0_8_;
        *(undefined8 *)((pTVar3->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
        *(undefined8 *)(pTVar3->m).m[1] = local_a8.m.m[1]._0_8_;
        *(undefined8 *)((pTVar3->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
        *(undefined8 *)(pTVar3->m).m[2] = local_a8.m.m[2]._0_8_;
        *(undefined8 *)((pTVar3->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
        *(undefined8 *)(pTVar3->m).m[3] = local_a8.m.m[3]._0_8_;
        *(undefined8 *)((pTVar3->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
      }
      i = 1;
      bVar2 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

void ParsedScene::Identity(FileLoc loc) {
    VERIFY_INITIALIZED("Identity");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = pbrt::Transform();)
}